

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O0

aphy_error __thiscall aphy::ref_counter<aphy::engine>::release(ref_counter<aphy::engine> *this)

{
  __int_type _Var1;
  __atomic_base<unsigned_int> *this_00;
  void *in_RDI;
  __int_type old;
  __atomic_base<unsigned_int> *in_stack_ffffffffffffffb8;
  aphy_error local_1c;
  
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int(in_stack_ffffffffffffffb8);
  if (_Var1 == 0) {
    local_1c = APHY_INVALID_OPERATION;
  }
  else {
    this_00 = (__atomic_base<unsigned_int> *)((long)in_RDI + 0x10);
    LOCK();
    _Var1 = this_00->_M_i;
    this_00->_M_i = this_00->_M_i - 1;
    UNLOCK();
    if (_Var1 == 0) {
      local_1c = APHY_INVALID_OPERATION;
    }
    else {
      if (_Var1 == 1) {
        if (*(long **)((long)in_RDI + 8) != (long *)0x0) {
          (**(code **)(**(long **)((long)in_RDI + 8) + 8))();
        }
        _Var1 = std::__atomic_base::operator_cast_to_unsigned_int(this_00);
        if ((_Var1 == 0) && (in_RDI != (void *)0x0)) {
          ::operator_delete(in_RDI);
        }
      }
      local_1c = APHY_OK;
    }
  }
  return local_1c;
}

Assistant:

aphy_error release()
    {
        // First sanity check.
        if(strongCount == 0)
            return APHY_INVALID_OPERATION;

        // Decrease the strong count.
        auto old = strongCount.fetch_sub(1, std::memory_order_relaxed);

        // Check again, for concurrency reasons.
        if(old == 0)
            return APHY_INVALID_OPERATION;

        // Should I delete the object?
        if(old == 1)
        {
            delete object;

            // Should I delete myself?
            if(weakCount == 0)
                delete this;
        }

        return APHY_OK;
    }